

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QualifierParser.cpp
# Opt level: O3

void __thiscall Refal2::CQualifierParser::addWord(CQualifierParser *this)

{
  CQualifierBuilder *this_00;
  int *piVar1;
  byte bVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  ulong uVar6;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  string local_68;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  if ((this->token).word._M_string_length != 0) {
    this_00 = &this->builder;
    uVar6 = 0;
    do {
      bVar2 = (this->token).word._M_dataplus._M_p[uVar6];
      if (bVar2 < 0x62) {
        switch(bVar2) {
        case 0x42:
switchD_0012f054_caseD_42:
          CQualifierBuilder::AddB(this_00);
          break;
        case 0x43:
        case 0x45:
        case 0x47:
        case 0x48:
        case 0x49:
        case 0x4a:
        case 0x4b:
        case 0x4d:
switchD_0012f054_caseD_43:
          piVar1 = &(this->token).position;
          *piVar1 = *piVar1 + (int)uVar6;
          local_48[0] = local_38;
          std::__cxx11::string::_M_construct((ulong)local_48,'\x01');
          plVar3 = (long *)std::__cxx11::string::replace((ulong)local_48,0,(char *)0x0,0x13a443);
          plVar4 = plVar3 + 2;
          if ((long *)*plVar3 == plVar4) {
            local_78 = *plVar4;
            lStack_70 = plVar3[3];
            local_88 = &local_78;
          }
          else {
            local_78 = *plVar4;
            local_88 = (long *)*plVar3;
          }
          local_80 = plVar3[1];
          *plVar3 = (long)plVar4;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_88);
          psVar5 = (size_type *)(plVar3 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar3 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar5) {
            local_68.field_2._M_allocated_capacity = *psVar5;
            local_68.field_2._8_8_ = plVar3[3];
            local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
          }
          else {
            local_68.field_2._M_allocated_capacity = *psVar5;
            local_68._M_dataplus._M_p = (pointer)*plVar3;
          }
          local_68._M_string_length = plVar3[1];
          *plVar3 = (long)psVar5;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          error(this,&local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p);
          }
          if (local_88 != &local_78) {
            operator_delete(local_88);
          }
          if (local_48[0] == local_38) {
            return;
          }
          operator_delete(local_48[0]);
          return;
        case 0x44:
switchD_0012f054_caseD_44:
          CQualifierBuilder::AddD(this_00);
          break;
        case 0x46:
switchD_0012f054_caseD_46:
          CQualifierBuilder::AddF(this_00);
          break;
        case 0x4c:
switchD_0012f054_caseD_4c:
          CQualifierBuilder::AddL(this_00);
          break;
        case 0x4e:
switchD_0012f054_caseD_4e:
          CQualifierBuilder::AddN(this_00);
          break;
        default:
          if (bVar2 != 0x53) {
            if (bVar2 != 0x57) goto switchD_0012f054_caseD_43;
            goto LAB_0012f0ca;
          }
LAB_0012f088:
          CQualifierBuilder::AddF(this_00);
          CQualifierBuilder::AddN(this_00);
        case 0x4f:
switchD_0012f054_caseD_4f:
          CQualifierBuilder::AddO(this_00);
        }
      }
      else {
        switch(bVar2) {
        case 0x62:
          goto switchD_0012f054_caseD_42;
        case 99:
        case 0x65:
        case 0x67:
        case 0x68:
        case 0x69:
        case 0x6a:
        case 0x6b:
        case 0x6d:
          goto switchD_0012f054_caseD_43;
        case 100:
          goto switchD_0012f054_caseD_44;
        case 0x66:
          goto switchD_0012f054_caseD_46;
        case 0x6c:
          goto switchD_0012f054_caseD_4c;
        case 0x6e:
          goto switchD_0012f054_caseD_4e;
        case 0x6f:
          goto switchD_0012f054_caseD_4f;
        default:
          if (bVar2 != 0x77) {
            if (bVar2 != 0x73) goto switchD_0012f054_caseD_43;
            goto LAB_0012f088;
          }
LAB_0012f0ca:
          CQualifierBuilder::AddW(this_00);
        }
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (this->token).word._M_string_length);
  }
  this->afterRightParen = false;
  return;
}

Assistant:

void CQualifierParser::addWord()
{
	for( std::string::size_type i = 0; i < token.word.length(); i++ ) {
		switch( token.word[i] ) {
			case 's': case 'S':
				builder.AddS();
				break;
			case 'f': case 'F':
				builder.AddF();
				break;
			case 'n': case 'N':
				builder.AddN();
				break;
			case 'o': case 'O':
				builder.AddO();
				break;
			case 'l': case 'L':
				builder.AddL();
				break;
			case 'd': case 'D':
				builder.AddD();
				break;
			case 'w': case 'W':
				builder.AddW();
				break;
			case 'b': case 'B':
				builder.AddB();
				break;
			default:
				token.position += i;
				error( "primary qualifier `" +
					std::string( 1, token.word[i] ) + "` does not exist" );
				return;
		}
	}
	afterRightParen = false;
}